

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_pushexternalstring(lua_State *L,char *s,size_t len,lua_Alloc falloc,void *ud)

{
  StkId pSVar1;
  TString *pTVar2;
  char **local_50;
  TString *x_;
  TValue *io;
  TString *ts;
  void *ud_local;
  lua_Alloc falloc_local;
  size_t len_local;
  char *s_local;
  lua_State *L_local;
  
  pTVar2 = luaS_newextlstr(L,s,len,falloc,ud);
  pSVar1 = (L->top).p;
  *(TString **)pSVar1 = pTVar2;
  (pSVar1->val).tt_ = pTVar2->tt | 0x40;
  (L->top).p = (StkId)((L->top).offset + 0x10);
  if (L->l_G->GCdebt < 1) {
    luaC_step(L);
  }
  if (pTVar2->shrlen < '\0') {
    local_50 = (char **)pTVar2->contents;
  }
  else {
    local_50 = &pTVar2->contents;
  }
  return (char *)local_50;
}

Assistant:

LUA_API const char *lua_pushexternalstring (lua_State *L,
	        const char *s, size_t len, lua_Alloc falloc, void *ud) {
  TString *ts;
  lua_lock(L);
  api_check(L, len <= MAX_SIZE, "string too large");
  api_check(L, s[len] == '\0', "string not ending with zero");
  ts = luaS_newextlstr (L, s, len, falloc, ud);
  setsvalue2s(L, L->top.p, ts);
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return getstr(ts);
}